

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeSetColName(Vdbe *p,int idx,int var,char *zName,_func_void_void_ptr *xDel)

{
  Mem *pColName;
  int rc;
  _func_void_void_ptr *xDel_local;
  char *zName_local;
  int var_local;
  int idx_local;
  Vdbe *p_local;
  
  if (p->db->mallocFailed == '\0') {
    p_local._4_4_ =
         sqlite3VdbeMemSetStr
                   (p->aColName + (int)(idx + var * (uint)p->nResColumn),zName,-1,'\x01',xDel);
  }
  else {
    p_local._4_4_ = 7;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSetColName(
  Vdbe *p,                         /* Vdbe being configured */
  int idx,                         /* Index of column zName applies to */
  int var,                         /* One of the COLNAME_* constants */
  const char *zName,               /* Pointer to buffer containing name */
  void (*xDel)(void*)              /* Memory management strategy for zName */
){
  int rc;
  Mem *pColName;
  assert( idx<p->nResColumn );
  assert( var<COLNAME_N );
  if( p->db->mallocFailed ){
    assert( !zName || xDel!=SQLITE_DYNAMIC );
    return SQLITE_NOMEM_BKPT;
  }
  assert( p->aColName!=0 );
  pColName = &(p->aColName[idx+var*p->nResColumn]);
  rc = sqlite3VdbeMemSetStr(pColName, zName, -1, SQLITE_UTF8, xDel);
  assert( rc!=0 || !zName || (pColName->flags&MEM_Term)!=0 );
  return rc;
}